

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Escape::CGraph::print(CGraph *this,FILE *f)

{
  long local_28;
  EdgeIdx j;
  VertexIdx i;
  FILE *f_local;
  CGraph *this_local;
  
  fprintf((FILE *)f,"nVertices=%lld nEdges=%lld\n",this->nVertices,this->nEdges);
  for (j = 0; j < this->nVertices; j = j + 1) {
    fprintf((FILE *)f,"%lld: ",j);
    local_28 = this->offsets[j];
    while( true ) {
      if (this->offsets[j + 1] <= local_28) break;
      fprintf((FILE *)f,"%lld ",this->nbors[local_28]);
      local_28 = local_28 + 1;
    }
    fprintf((FILE *)f,"\n");
  }
  return;
}

Assistant:

void CGraph::print(FILE *f) const {
    fprintf(f, "nVertices=%lld nEdges=%lld\n", (int64_t) nVertices, (int64_t) nEdges);
    for (VertexIdx i = 0; i < nVertices; ++i) {
        fprintf(f, "%lld: ", (int64_t) i);
        for (EdgeIdx j = offsets[i]; j < offsets[i + 1]; ++j)
            fprintf(f, "%lld ", (int64_t) nbors[j]);
        fprintf(f, "\n");
    }
}